

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,char *signame,size_t signame_len)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  size_t signame_len_local;
  char *signame_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ = channel_signal(channel,signame,signame_len);
      if ((entry_time._4_4_ != -0x25) || (channel->session->api_block_mode == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(channel->session,start_time);
    } while (entry_time._4_4_ == 0);
    channel_local._4_4_ = entry_time._4_4_;
  }
  return channel_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,
                          const char *signame,
                          size_t signame_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_signal(channel, signame, signame_len));
    return rc;
}